

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O2

int mbedtls_rsa_rsassa_pss_verify_ext
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,mbedtls_md_type_t md_alg,uint hashlen,uchar *hash,
              mbedtls_md_type_t mgf1_hash_id,int expected_salt_len,uchar *sig)

{
  ulong uVar1;
  uchar *dst;
  byte bVar2;
  int iVar3;
  mbedtls_md_info_t *pmVar4;
  size_t sVar5;
  ulong uVar6;
  size_t sVar7;
  ulong slen;
  size_t sVar8;
  long lVar9;
  mbedtls_md_context_t md_ctx;
  uchar zeros [8];
  uchar result [64];
  uchar buf [1024];
  
  if ((mode == 1) && (ctx->padding != 1)) {
    return -0x4080;
  }
  sVar7 = ctx->len;
  if (0xfffffffffffffc0e < sVar7 - 0x401) {
    if (mode == 0) {
      iVar3 = mbedtls_rsa_public(ctx,sig,buf);
    }
    else {
      iVar3 = mbedtls_rsa_private(ctx,f_rng,p_rng,sig,buf);
    }
    if (iVar3 != 0) {
      return iVar3;
    }
    if (result[sVar7 + 0x3f] != 0xbc) {
      return -0x4100;
    }
    if (md_alg != MBEDTLS_MD_NONE) {
      pmVar4 = mbedtls_md_info_from_type(md_alg);
      if (pmVar4 == (mbedtls_md_info_t *)0x0) {
        return -0x4080;
      }
      bVar2 = mbedtls_md_get_size(pmVar4);
      hashlen = (uint)bVar2;
    }
    pmVar4 = mbedtls_md_info_from_type(mgf1_hash_id);
    if (pmVar4 != (mbedtls_md_info_t *)0x0) {
      bVar2 = mbedtls_md_get_size(pmVar4);
      zeros[0] = '\0';
      zeros[1] = '\0';
      zeros[2] = '\0';
      zeros[3] = '\0';
      zeros[4] = '\0';
      zeros[5] = '\0';
      zeros[6] = '\0';
      zeros[7] = '\0';
      sVar5 = mbedtls_mpi_bitlen(&ctx->N);
      uVar1 = sVar5 - 1;
      sVar8 = sVar7 - 1;
      if ((uVar1 & 7) != 0) {
        sVar8 = sVar7;
      }
      if (buf[0] >> ((char)sVar5 + (char)sVar8 * -8 + 7U & 0x1f) != 0) {
        return -0x4080;
      }
      slen = (ulong)bVar2;
      uVar6 = (ulong)((uVar1 & 7) == 0);
      dst = buf + uVar6;
      mbedtls_md_init(&md_ctx);
      mbedtls_md_setup(&md_ctx,pmVar4,0);
      mgf_mask(dst,~slen + sVar8,dst + sVar8 + ~slen,slen,&md_ctx);
      buf[0] = buf[0] & (byte)(0xff >> ((char)sVar8 * '\b' - (char)uVar1 & 0x1fU));
      for (lVar9 = 0; (dst + lVar9 < buf + sVar8 && (dst[lVar9] == '\0')); lVar9 = lVar9 + 1) {
      }
      if (((sVar8 - uVar6 != lVar9) && (dst[lVar9] == '\x01')) &&
         ((expected_salt_len == -1 ||
          ((((sVar7 - (long)expected_salt_len) - slen) - uVar6) + -2 == lVar9)))) {
        sVar7 = (((sVar7 - slen) - uVar6) - lVar9) - 2;
        mbedtls_md_starts(&md_ctx);
        mbedtls_md_update(&md_ctx,zeros,8);
        mbedtls_md_update(&md_ctx,hash,(ulong)hashlen);
        mbedtls_md_update(&md_ctx,dst + lVar9 + 1,sVar7);
        mbedtls_md_finish(&md_ctx,result);
        mbedtls_md_free(&md_ctx);
        iVar3 = bcmp(dst + lVar9 + 1 + sVar7,result,slen);
        if (iVar3 == 0) {
          return 0;
        }
        return -0x4380;
      }
      mbedtls_md_free(&md_ctx);
      return -0x4100;
    }
  }
  return -0x4080;
}

Assistant:

int mbedtls_rsa_rsassa_pss_verify_ext( mbedtls_rsa_context *ctx,
                               int (*f_rng)(void *, unsigned char *, size_t),
                               void *p_rng,
                               int mode,
                               mbedtls_md_type_t md_alg,
                               unsigned int hashlen,
                               const unsigned char *hash,
                               mbedtls_md_type_t mgf1_hash_id,
                               int expected_salt_len,
                               const unsigned char *sig )
{
    int ret;
    size_t siglen;
    unsigned char *p;
    unsigned char buf[MBEDTLS_MPI_MAX_SIZE];
    unsigned char result[MBEDTLS_MD_MAX_SIZE];
    unsigned char zeros[8];
    unsigned int hlen;
    size_t slen, msb;
    const mbedtls_md_info_t *md_info;
    mbedtls_md_context_t md_ctx;

    if( mode == MBEDTLS_RSA_PRIVATE && ctx->padding != MBEDTLS_RSA_PKCS_V21 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    siglen = ctx->len;

    if( siglen < 16 || siglen > sizeof( buf ) )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    ret = ( mode == MBEDTLS_RSA_PUBLIC )
          ? mbedtls_rsa_public(  ctx, sig, buf )
          : mbedtls_rsa_private( ctx, f_rng, p_rng, sig, buf );

    if( ret != 0 )
        return( ret );

    p = buf;

    if( buf[siglen - 1] != 0xBC )
        return( MBEDTLS_ERR_RSA_INVALID_PADDING );

    if( md_alg != MBEDTLS_MD_NONE )
    {
        // Gather length of hash to sign
        //
        md_info = mbedtls_md_info_from_type( md_alg );
        if( md_info == NULL )
            return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

        hashlen = mbedtls_md_get_size( md_info );
    }

    md_info = mbedtls_md_info_from_type( mgf1_hash_id );
    if( md_info == NULL )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    hlen = mbedtls_md_get_size( md_info );
    slen = siglen - hlen - 1; /* Currently length of salt + padding */

    memset( zeros, 0, 8 );

    // Note: EMSA-PSS verification is over the length of N - 1 bits
    //
    msb = mbedtls_mpi_bitlen( &ctx->N ) - 1;

    // Compensate for boundary condition when applying mask
    //
    if( msb % 8 == 0 )
    {
        p++;
        siglen -= 1;
    }
    if( buf[0] >> ( 8 - siglen * 8 + msb ) )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    mbedtls_md_init( &md_ctx );
    mbedtls_md_setup( &md_ctx, md_info, 0 );

    mgf_mask( p, siglen - hlen - 1, p + siglen - hlen - 1, hlen, &md_ctx );

    buf[0] &= 0xFF >> ( siglen * 8 - msb );

    while( p < buf + siglen && *p == 0 )
        p++;

    if( p == buf + siglen ||
        *p++ != 0x01 )
    {
        mbedtls_md_free( &md_ctx );
        return( MBEDTLS_ERR_RSA_INVALID_PADDING );
    }

    /* Actual salt len */
    slen -= p - buf;

    if( expected_salt_len != MBEDTLS_RSA_SALT_LEN_ANY &&
        slen != (size_t) expected_salt_len )
    {
        mbedtls_md_free( &md_ctx );
        return( MBEDTLS_ERR_RSA_INVALID_PADDING );
    }

    // Generate H = Hash( M' )
    //
    mbedtls_md_starts( &md_ctx );
    mbedtls_md_update( &md_ctx, zeros, 8 );
    mbedtls_md_update( &md_ctx, hash, hashlen );
    mbedtls_md_update( &md_ctx, p, slen );
    mbedtls_md_finish( &md_ctx, result );

    mbedtls_md_free( &md_ctx );

    if( memcmp( p + slen, result, hlen ) == 0 )
        return( 0 );
    else
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );
}